

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCScene::~ISPCScene(ISPCScene *this)

{
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  alignedUSMFree((void *)0x185fcb);
  alignedUSMFree((void *)0x185fda);
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x28); local_10 = local_10 + 1) {
    Light_destroy((Light *)0x18600c);
  }
  alignedUSMFree((void *)0x18602d);
  return;
}

Assistant:

ISPCScene::~ISPCScene()
  {
    alignedUSMFree(geometries);
    alignedUSMFree(materials);

    for (size_t i=0; i<numLights; i++)
      Light_destroy(lights[i]);
    alignedUSMFree(lights);
  }